

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_zisofs.c
# Opt level: O0

void test_write_format_iso9660_zisofs_3(void)

{
  int iVar1;
  mode_t mVar2;
  uint uVar3;
  la_ssize_t lVar4;
  time_t tVar5;
  time_t tVar6;
  char *pcVar7;
  la_int64_t lVar8;
  uint local_c34;
  int r;
  uint i;
  size_t used;
  size_t buffsize;
  uchar *buff;
  archive_entry *ae;
  archive *a;
  uchar nullb [2048];
  uchar buff2 [1024];
  
  used = 0x19000;
  memset(&a,0,0x800);
  buffsize = (size_t)malloc(used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                   ,L'ɑ',(uint)((void *)buffsize != (void *)0x0),"buff != NULL",(void *)0x0);
  if (buffsize != 0) {
    ae = (archive_entry *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                     ,L'ɖ',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_iso9660((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                        ,L'ɗ',0,"0",(long)iVar1,"archive_write_set_format_iso9660(a)",ae);
    iVar1 = archive_write_add_filter_none((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                        ,L'ɘ',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",ae);
    iVar1 = archive_write_set_option((archive *)ae,(char *)0x0,"zisofs","1");
    if (iVar1 == -0x1e) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                     ,L'ɛ');
      test_skipping("zisofs option not supported on this platform");
      iVar1 = archive_write_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ɜ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free((void *)buffsize);
    }
    else {
      iVar1 = archive_write_set_option((archive *)ae,(char *)0x0,"boot","boot.img");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ɠ',0,"0",(long)iVar1,
                          "archive_write_set_option(a, NULL, \"boot\", \"boot.img\")",ae);
      iVar1 = archive_write_set_option((archive *)ae,(char *)0x0,"pad",(char *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ɡ',0,"0",(long)iVar1,
                          "archive_write_set_option(a, NULL, \"pad\", NULL)",ae);
      iVar1 = archive_write_open_memory((archive *)ae,(void *)buffsize,used,(size_t *)&r);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ɢ',0,"0",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ɧ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"boot.img");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x2800);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ɯ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar4 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ɱ',0x400,"1024",lVar4,"archive_write_data(a, nullb, 1024)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ɶ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file2");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x800);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ɾ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar4 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʀ',0x400,"1024",lVar4,"archive_write_data(a, nullb, 1024)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ʅ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file3");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x801);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʍ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar4 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʏ',0x400,"1024",lVar4,"archive_write_data(a, nullb, 1024)",ae);
      iVar1 = archive_write_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʒ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
      iVar1 = archive_write_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʓ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",ae);
      failure("The ISO image size should be 81920 bytes.");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʖ',_r,"used",0x14000,"2048 * 40",(void *)0x0);
      for (local_c34 = 0; local_c34 < 0x8000; local_c34 = local_c34 + 1) {
        failure("System Area should be all nulls.");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'ʛ',(ulong)*(byte *)(buffsize + local_c34),"buff[i]",0,"0",
                            (void *)0x0);
      }
      failure("Primary Volume Descriptor should be in 16 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʠ',(void *)(buffsize + 0x8000),"buff+2048*16","\x01CD001\x01",
                          "primary_id",8,"8",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʢ',(void *)(buffsize + 0x8028),"buff+2048*16+0x28",
                          "CDROM                           ","\"CDROM                           \"",
                          0x20,"32",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʣ',(void *)(buffsize + 0x8050),"buff+2048*16+0x50","(","volumesize3",8
                          ,"8",(void *)0x0);
      failure("Boot Volume Descriptor should be in 17 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʧ',(void *)(buffsize + 0x8800),"buff+2048*17","","boot_id",0x26,
                          "sizeof(boot_id)",(void *)0x0);
      for (local_c34 = 0x27; local_c34 < 0x47; local_c34 = local_c34 + 1) {
        failure("Unused area must be all nulls.");
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                         ,L'ʪ',(uint)(*(char *)(buffsize + (local_c34 + 0x8800)) == '\0'),
                         "buff[2048*17+i] == 0",(void *)0x0);
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ʭ',(uint)(*(char *)(buffsize + 0x8847) == ' '),
                       "buff[2048*17+0x47] == 0x20",(void *)0x0);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ʮ',(uint)(*(char *)(buffsize + 0x8848) == '\0'),
                       "buff[2048*17+0x48] == 0x00",(void *)0x0);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ʯ',(uint)(*(char *)(buffsize + 0x8849) == '\0'),
                       "buff[2048*17+0x49] == 0x00",(void *)0x0);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ʰ',(uint)(*(char *)(buffsize + 0x884a) == '\0'),
                       "buff[2048*17+0x4a] == 0x00",(void *)0x0);
      for (local_c34 = 0x4a; local_c34 < 0x800; local_c34 = local_c34 + 1) {
        failure("Unused area must be all nulls.");
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                         ,L'ʳ',(uint)(*(char *)(buffsize + (local_c34 + 0x8800)) == '\0'),
                         "buff[2048*17+i] == 0",(void *)0x0);
      }
      failure("Supplementary Volume(Joliet) Descriptor should be in 18 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʹ',(void *)(buffsize + 0x9000),"buff+2048*18","\x02CD001\x01",
                          "supplementary_id",8,"8",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʺ',(void *)(buffsize + 0x9028),"buff+2048*18+0x28","","volumeidu16",
                          0x20,"32",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʻ',(void *)(buffsize + 0x9050),"buff+2048*18+0x50","(","volumesize3",8
                          ,"8",(void *)0x0);
      failure(
             "Date and Time of Primary Volume and Date and Time of Supplementary Volume must be the same."
             );
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ʿ',(void *)(buffsize + 0x832d),"buff+2048*16+0x32d",
                          (void *)(buffsize + 0x932d),"buff+2048*18+0x32d",0x44,"0x44",(void *)0x0);
      failure("Volume Descriptor Set Terminator should be in 19 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˄',(void *)(buffsize + 0x9800),"buff+2048*19",terminator_id,
                          "terminator_id",8,"8",(void *)0x0);
      for (local_c34 = 8; local_c34 < 0x800; local_c34 = local_c34 + 1) {
        failure("Body of Volume Descriptor Set Terminator should be all nulls.");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'ˈ',(ulong)*(byte *)(buffsize + (local_c34 + 0x9800)),
                            "buff[2048*19+i]",0,"0",(void *)0x0);
      }
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ˌ',(void *)(buffsize + 0xf800),"buff+2048*31",el_torito_signature,
                          "el_torito_signature",0xed,"237",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ˍ',(void *)(buffsize + 0xf8ed),"buff+2048*31+237",&a,"nullb",0x713,
                          "2048-237",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ː',(void *)(buffsize + 0x10000),"buff+2048*32","\x01","boot_catalog",
                          0x40,"64",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ˑ',(void *)(buffsize + 0x10040),"buff+2048*32+64",&a,"nullb",0x7c0,
                          "2048-64",(void *)0x0);
      failure("boot.img image should not be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˕',(void *)(buffsize + 0x10800),"buff+2048*33",&a,"nullb",0x800,"2048"
                          ,(void *)0x0);
      for (local_c34 = 0x11000; local_c34 < 0x13000; local_c34 = local_c34 + 0x800) {
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'˗',(void *)(buffsize + local_c34),"buff+i",&a,"nullb",0x800,"2048",
                            (void *)0x0);
      }
      failure("file2 image should not be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˜',(void *)(buffsize + 0x13000),"buff+2048*38",&a,"nullb",8,"8",
                          (void *)0x0);
      failure("file3 image should be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˟',(void *)(buffsize + 0x13800),"buff+2048*39",zisofs_magic,
                          "zisofs_magic",8,"8",(void *)0x0);
      ae = (archive_entry *)archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ˤ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˥',0,"0",(long)iVar1,"archive_read_support_format_all(a)",ae);
      iVar1 = archive_read_support_filter_all((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˦',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",ae);
      iVar1 = archive_read_open_memory((archive *)ae,(void *)buffsize,_r);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˧',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",ae);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˭',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar5 = archive_entry_atime((archive_entry *)buff);
      tVar6 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ˮ',tVar5,"archive_entry_atime(ae)",tVar6,"archive_entry_ctime(ae)",
                          (void *)0x0);
      tVar5 = archive_entry_atime((archive_entry *)buff);
      tVar6 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˯',tVar5,"archive_entry_atime(ae)",tVar6,"archive_entry_mtime(ae)",
                          (void *)0x0);
      pcVar7 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'˰',".","\".\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'˱',(uint)(mVar2 == 0x416d),"(S_IFDIR | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar8 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˲',0x800,"2048",lVar8,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˷',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      pcVar7 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'˸',"boot.catalog","\"boot.catalog\"",pcVar7,"archive_entry_pathname(ae)",
                 (void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'˺',(uint)(mVar2 == 0x8124),"(S_IFREG | 0444) == archive_entry_mode(ae)",
                       (void *)0x0);
      uVar3 = archive_entry_nlink((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'˿',1,"1",(ulong)uVar3,"archive_entry_nlink(ae)",(void *)0x0);
      lVar8 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̀',0x800,"2*1024",lVar8,"archive_entry_size(ae)",(void *)0x0);
      lVar4 = archive_read_data((archive *)ae,nullb + 0x7f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'́',0x400,"1024",lVar4,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̂',nullb + 0x7f8,"buff2","\x01","boot_catalog",0x40,"64",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̇',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar5 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̈',2,"2",tVar5,"archive_entry_atime(ae)",(void *)0x0);
      tVar5 = archive_entry_birthtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̉',3,"3",tVar5,"archive_entry_birthtime(ae)",(void *)0x0);
      tVar5 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̊',4,"4",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
      tVar5 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̋',5,"5",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar7 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'̌',"boot.img","\"boot.img\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,
                 L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'̍',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      uVar3 = archive_entry_nlink((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̎',1,"1",(ulong)uVar3,"archive_entry_nlink(ae)",(void *)0x0);
      lVar8 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̏',0x2800,"10*1024",lVar8,"archive_entry_size(ae)",(void *)0x0);
      lVar4 = archive_read_data((archive *)ae,nullb + 0x7f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̐',0x400,"1024",lVar4,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̑',nullb + 0x7f8,"buff2",&a,"nullb",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̖',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar5 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̗',2,"2",tVar5,"archive_entry_atime(ae)",(void *)0x0);
      tVar5 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̘',4,"4",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
      tVar5 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̙',5,"5",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar7 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'̚',"file2","\"file2\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'̛',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar8 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̜',0x800,"2048",lVar8,"archive_entry_size(ae)",(void *)0x0);
      lVar4 = archive_read_data((archive *)ae,nullb + 0x7f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̝',0x400,"1024",lVar4,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̞',nullb + 0x7f8,"buff2",&a,"nullb",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̣',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar5 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̤',2,"2",tVar5,"archive_entry_atime(ae)",(void *)0x0);
      tVar5 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̥',4,"4",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
      tVar5 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̦',5,"5",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar7 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'̧',"file3","\"file3\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'̨',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar8 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̩',0x801,"2049",lVar8,"archive_entry_size(ae)",(void *)0x0);
      lVar4 = archive_read_data((archive *)ae,nullb + 0x7f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̪',0x400,"1024",lVar4,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̫',nullb + 0x7f8,"buff2",&a,"nullb",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̰',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      iVar1 = archive_read_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̱',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
      iVar1 = archive_read_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'̲',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",ae);
      free((void *)buffsize);
    }
  }
  return;
}

Assistant:

static void
test_write_format_iso9660_zisofs_3(void)
{
	unsigned char buff2[1024];
	unsigned char nullb[2048];
	struct archive *a;
	struct archive_entry *ae;
	unsigned char *buff;
	size_t buffsize = 50 * 2048;
	size_t used;
	unsigned int i;
	int r;

	memset(nullb, 0, sizeof(nullb));
	buff = malloc(buffsize);
	assert(buff != NULL);
	if (buff == NULL)
		return;

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_iso9660(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	r = archive_write_set_option(a, NULL, "zisofs", "1");
	if (r == ARCHIVE_FATAL) {
		skipping("zisofs option not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, 0, archive_write_set_option(a, NULL, "boot", "boot.img"));
	assertEqualIntA(a, 0, archive_write_set_option(a, NULL, "pad", NULL));
	assertEqualIntA(a, 0, archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file1" has a bunch of attributes and 256K bytes of null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "boot.img");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 10*1024);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 1024, archive_write_data(a, nullb, 1024));

	/*
	 * "file2" has a bunch of attributes and 2048 bytes of null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 2048);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 1024, archive_write_data(a, nullb, 1024));

	/*
	 * "file3" has a bunch of attributes and 2049 bytes of null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 2049);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 1024, archive_write_data(a, nullb, 1024));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	failure("The ISO image size should be 81920 bytes.");
	assertEqualInt(used, 2048 * 40);

	/* Check System Area. */
	for (i = 0; i < 2048 * 16; i++) {
		failure("System Area should be all nulls.");
		assertEqualInt(buff[i], 0);
	}

	/* Primary Volume. */
	failure("Primary Volume Descriptor should be in 16 Logical Sector.");
	assertEqualMem(buff+2048*16, primary_id, 8);
	assertEqualMem(buff+2048*16+0x28,
	    "CDROM                           ", 32);
	assertEqualMem(buff+2048*16+0x50, volumesize3, 8);

	/* Boot Volume. */
	failure("Boot Volume Descriptor should be in 17 Logical Sector.");
	assertEqualMem(buff+2048*17, boot_id, sizeof(boot_id));
	for (i = 0x27; i <= 0x46; i++) {
		failure("Unused area must be all nulls.");
		assert(buff[2048*17+i] == 0);
	}
	/* First sector of Boot Catalog. */
	assert(buff[2048*17+0x47] == 0x20);
	assert(buff[2048*17+0x48] == 0x00);
	assert(buff[2048*17+0x49] == 0x00);
	assert(buff[2048*17+0x4a] == 0x00);
	for (i = 0x4a; i <= 0x7ff; i++) {
		failure("Unused area must be all nulls.");
		assert(buff[2048*17+i] == 0);
	}

	/* Supplementary Volume. */
	failure("Supplementary Volume(Joliet) Descriptor "
	    "should be in 18 Logical Sector.");
	assertEqualMem(buff+2048*18, supplementary_id, 8);
	assertEqualMem(buff+2048*18+0x28, volumeidu16, 32);
	assertEqualMem(buff+2048*18+0x50, volumesize3, 8);
	failure("Date and Time of Primary Volume and "
	    "Date and Time of Supplementary Volume "
	    "must be the same.");
	assertEqualMem(buff+2048*16+0x32d, buff+2048*18+0x32d, 0x44);

	/* Terminator. */
	failure("Volume Descriptor Set Terminator "
	    "should be in 19 Logical Sector.");
	assertEqualMem(buff+2048*19, terminator_id, 8);
	for (i = 8; i < 2048; i++) {
		failure("Body of Volume Descriptor Set Terminator "
		    "should be all nulls.");
		assertEqualInt(buff[2048*19+i], 0);
	}

	/* Check signature of El-Torito. */
	assertEqualMem(buff+2048*31, el_torito_signature, 237);
	assertEqualMem(buff+2048*31+237, nullb, 2048-237);

	/* Check contents of "boot.catalog". */
	assertEqualMem(buff+2048*32, boot_catalog, 64);
	assertEqualMem(buff+2048*32+64, nullb, 2048-64);

	/* Check contents of "boot.img". */
	failure("boot.img image should not be zisofs'ed.");
	assertEqualMem(buff+2048*33, nullb, 2048);
	for (i = 2048*34; i < 2048*38; i += 2048) {
		assertEqualMem(buff+i, nullb, 2048);
	}

	/* "file2"  Contents is not zisofs data. */
	failure("file2 image should not be zisofs'ed.");
	assertEqualMem(buff+2048*38, nullb, 8);
	/* "file3"  Contents is zisofs data. */
	failure("file3 image should be zisofs'ed.");
	assertEqualMem(buff+2048*39, zisofs_magic, 8);

	/*
	 * Read ISO image.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read Root Directory
	 * Root Directory entry must be in ISO image.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_ctime(ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_mtime(ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assert((S_IFDIR | 0555) == archive_entry_mode(ae));
	assertEqualInt(2048, archive_entry_size(ae));

	/*
	 * Read "boot.catalog".
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString("boot.catalog", archive_entry_pathname(ae));
#if !defined(_WIN32) && !defined(__CYGWIN__)
	assert((S_IFREG | 0444) == archive_entry_mode(ae));
#else
	/* On Windows and CYGWIN, always set all exec bit ON by default. */ 
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
#endif
	assertEqualInt(1, archive_entry_nlink(ae));
	assertEqualInt(2*1024, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, boot_catalog, 64);

	/*
	 * Read "boot.img".
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(3, archive_entry_birthtime(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("boot.img", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(1, archive_entry_nlink(ae));
	assertEqualInt(10*1024, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, nullb, 1024);

	/*
	 * Read "file2" which has 2048 bytes null data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, nullb, 1024);

	/*
	 * Read "file3" which has 2049 bytes null data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(2049, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, nullb, 1024);

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}